

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::
get_value<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
          (GeomPrimvar *this,double timecode,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *dest,
          TimeSampleInterpolationType interp,string *err)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Attribute *this_00;
  bool bVar3;
  undefined1 local_b8 [8];
  undefined8 *local_b0;
  undefined8 local_a0 [2];
  undefined4 local_8c;
  string local_88;
  string local_68;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> local_48;
  
  local_b8 = (undefined1  [8])timecode;
  if (dest == (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)0x0) {
joined_r0x001c2a69:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    args = err;
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar3 = false;
      }
      else {
        uVar2 = (*pvVar1->type_id)();
        bVar3 = uVar2 == 4;
      }
      if ((bVar3) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x001c2a69;
    }
    this_00 = &this->_attr;
    uVar2 = Attribute::type_id(this_00);
    bVar3 = IsSupportedGeomPrimvarType(uVar2);
    if (bVar3) {
      local_48.
      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = Attribute::
              get<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                        (this_00,(double)local_b8,&local_48,interp);
      if (bVar3) {
        std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::operator=
                  (dest,&local_48);
      }
      else if (err != (string *)0x0) {
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,
                   "Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`"
                   ,"");
        local_8c = 0x10002f;
        Attribute::type_name_abi_cxx11_(&local_88,this_00);
        fmt::format<double,unsigned_int,std::__cxx11::string>
                  (&local_68,(fmt *)&local_b0,(string *)local_b8,(double *)&local_8c,
                   (uint *)&local_88,in_R9);
        std::__cxx11::string::_M_append((char *)err,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0,local_a0[0] + 1);
        }
      }
      if (local_48.
          super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return bVar3;
      }
      operator_delete(local_48.
                      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return bVar3;
    }
    if (err != (string *)0x0) {
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Unsupported type for GeomPrimvar. type = `{}`","");
      Attribute::type_name_abi_cxx11_(&local_88,this_00);
      fmt::format<std::__cxx11::string>(&local_68,(fmt *)&local_b0,&local_88,args);
      std::__cxx11::string::_M_append((char *)err,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(double timecode, T *dest, value::TimeSampleInterpolationType interp, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
    if (err) {
      (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                            _attr.type_name());
    }
    return false;
  }

#if 0
  if (value::TimeCode(timecode).is_default()) {

    if (_attr.has_value()) {
      if (auto pv = _attr.get_value<T>()) {

        // copy
        (*dest) = pv.value();
        return true;

      } else {
        if (err) {
          (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
        }
        return false;
      }
    }

  }

  if (_attr.has_timesamples()) {
    T value;

    if (!_attr.get_value(timecode, &value, interp)) {
      if (err) {
        (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }

    // copy
    (*dest) = value;
    return true;
  }

  return false;
#else
  T value{};

  if (!_attr.get_value(timecode, &value, interp)) {
    if (err) {
      (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
    }
    return false;
  }

  // copy
  (*dest) = value;
  return true;
#endif

}